

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QIntC.hh
# Opt level: O0

void QIntC::range_check_error<unsigned_long_long>(unsigned_long_long *cur,unsigned_long_long *delta)

{
  unsigned_long_long uVar1;
  ostream *poVar2;
  range_error *this;
  ostringstream msg_1;
  string local_1c8 [48];
  locale local_198 [8];
  ostringstream local_190 [8];
  ostringstream msg;
  unsigned_long_long *delta_local;
  unsigned_long_long *cur_local;
  
  if ((*delta != 0) &&
     (uVar1 = std::numeric_limits<unsigned_long_long>::max(), uVar1 - *cur < *delta)) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::locale::classic();
    std::ios::imbue(local_198);
    std::locale::~locale(local_198);
    poVar2 = std::operator<<((ostream *)local_190,"adding ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*delta);
    poVar2 = std::operator<<(poVar2," to ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*cur);
    std::operator<<(poVar2," would cause an integer overflow");
    this = (range_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::range_error::range_error(this,local_1c8);
    __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  return;
}

Assistant:

void
    range_check_error(T const& cur, T const& delta)
    {
        if ((delta > 0) && ((std::numeric_limits<T>::max() - cur) < delta)) {
            std::ostringstream msg;
            msg.imbue(std::locale::classic());
            msg << "adding " << delta << " to " << cur << " would cause an integer overflow";
            throw std::range_error(msg.str());
        } else if ((delta < 0) && ((std::numeric_limits<T>::min() - cur) > delta)) {
            std::ostringstream msg;
            msg.imbue(std::locale::classic());
            msg << "adding " << delta << " to " << cur << " would cause an integer underflow";
            throw std::range_error(msg.str());
        }
    }